

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O3

SeedBuilder * tcu::operator<<(SeedBuilder *builder,float value)

{
  uint uVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  long lVar4;
  uint uVar5;
  deUint8 data [4];
  
  data = (deUint8  [4])value;
  uVar2 = builder->m_hash;
  lVar3 = 0;
  do {
    uVar2 = uVar2 ^ data[lVar3];
    lVar4 = 8;
    do {
      uVar5 = uVar2 >> 1;
      uVar1 = uVar2 & 1;
      uVar2 = uVar5 ^ 0x4c11db7;
      if (uVar1 == 0) {
        uVar2 = uVar5;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  builder->m_hash = uVar2;
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, float value)
{
	// \note Assume that float has same endianess as uint32.
	deUint32 val;

	deMemcpy(&val, &value, sizeof(deUint32));

	{
		const deUint8	data[]	=
		{
			(deUint8)(val & 0xFFu),
			(deUint8)((val >> 8) & 0xFFu),
			(deUint8)((val >> 16) & 0xFFu),
			(deUint8)((val >> 24) & 0xFFu),
		};

		builder.feed(sizeof(data), data);
		return builder;
	}
}